

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base64Encoding.cpp
# Opt level: O3

size_t axl::enc::Base64Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  byte *pbVar1;
  byte bVar2;
  BufHdr *pBVar3;
  char *__s;
  char cVar4;
  char *pcVar5;
  size_t length;
  long lVar7;
  undefined1 *puVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  bool bVar17;
  ulong uVar6;
  
  if (size == 0) {
    pBVar3 = (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar3 != (BufHdr *)0x0) {
      if ((pBVar3->super_RefCount).m_refCount == 1) {
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
             (C *)(pBVar3 + 1);
        *(undefined1 *)&pBVar3[1].super_RefCount._vptr_RefCount = 0;
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
      }
      else {
        sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                  (&string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
    return 0;
  }
  lVar7 = (ulong)(0x2aaaaaaaaaaaaaaa < size * 0x5555555555555558 >> 1) + (size * 8) / 6;
  uVar6 = 0;
  if ((flags & 1) == 0) {
    uVar6 = (ulong)(-(int)lVar7 & 3);
  }
  length = uVar6 + lVar7;
  if ((flags & 8) == 0) {
    __s = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer(string,length,false)
    ;
    if (__s == (C *)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar5 = __s + length;
    pbVar1 = (byte *)((long)p + size);
    if ((flags & 2) == 0) {
      if ((long)size < 1) goto LAB_001432c7;
      uVar11 = 0;
      lVar7 = 0;
      do {
        lVar10 = lVar7;
        bVar2 = *p;
        uVar11 = uVar11 << 8 | (uint)bVar2;
        lVar13 = 0;
        do {
          *__s = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [uVar11 >> ((char)lVar10 + (char)lVar13 + 2U & 0x1f) & 0x3f];
          __s = __s + 1;
          lVar7 = lVar10 + lVar13;
          lVar13 = lVar13 + -6;
        } while (5 < lVar7 + 2U);
        p = (void *)((long)p + 1);
        lVar7 = lVar10 + lVar13 + 8;
        puVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
      } while (p < pbVar1);
    }
    else {
      if ((long)size < 1) goto LAB_001432c7;
      puVar8 = GetBase64UrlChar::operator()(unsigned_char)::charTable;
      uVar11 = 0;
      lVar7 = 0;
      do {
        lVar10 = lVar7;
        bVar2 = *p;
        uVar11 = uVar11 << 8 | (uint)bVar2;
        lVar13 = 0;
        do {
          *__s = GetBase64UrlChar::operator()(unsigned_char)::charTable
                 [uVar11 >> ((char)lVar10 + (char)lVar13 + 2U & 0x1f) & 0x3f];
          __s = __s + 1;
          lVar7 = lVar10 + lVar13;
          lVar13 = lVar13 + -6;
        } while (5 < lVar7 + 2U);
        p = (void *)((long)p + 1);
        lVar7 = lVar10 + lVar13 + 8;
      } while (p < pbVar1);
    }
    if (lVar10 + lVar13 != -8) {
      *__s = puVar8[(uint)bVar2 << (-((char)lVar13 + (char)lVar10) - 2U & 0x1f) & 0x3f];
      __s = __s + 1;
    }
  }
  else {
    length = ((length >> 6) + length) - (ulong)((length & 0xfc0) == 0);
    __s = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer(string,length,false)
    ;
    if (__s == (C *)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar5 = __s + length;
    pbVar1 = (byte *)((long)p + size);
    if ((flags & 2) == 0) {
      if ((long)size < 1) goto LAB_001432c7;
      uVar9 = 0;
      uVar11 = 0;
      uVar6 = 0;
      do {
        bVar2 = *p;
        uVar11 = uVar11 << 8 | (uint)bVar2;
        uVar14 = uVar6 + 8;
        iVar12 = (int)uVar6 + 2;
        do {
          pcVar16 = __s;
          bVar17 = (uVar9 & 0x3f) == 0;
          if (bVar17) {
            *pcVar16 = '\n';
          }
          uVar15 = (ulong)bVar17;
          uVar14 = uVar14 - 6;
          __s = pcVar16 + uVar15 + 1;
          pcVar16[uVar15] =
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [uVar11 >> ((byte)iVar12 & 0x1f) & 0x3f];
          iVar12 = iVar12 + -6;
          cVar4 = (char)iVar12;
          uVar9 = uVar9 + 1;
        } while (5 < uVar14);
        p = (void *)((long)p + 1);
        puVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
        uVar6 = uVar14;
      } while (p < pbVar1);
    }
    else {
      if ((long)size < 1) goto LAB_001432c7;
      uVar9 = 0;
      puVar8 = GetBase64UrlChar::operator()(unsigned_char)::charTable;
      uVar11 = 0;
      uVar6 = 0;
      do {
        bVar2 = *p;
        uVar11 = uVar11 << 8 | (uint)bVar2;
        uVar14 = uVar6 + 8;
        iVar12 = (int)uVar6 + 2;
        do {
          pcVar16 = __s;
          bVar17 = (uVar9 & 0x3f) == 0;
          if (bVar17) {
            *pcVar16 = '\n';
          }
          uVar15 = (ulong)bVar17;
          uVar14 = uVar14 - 6;
          __s = pcVar16 + uVar15 + 1;
          pcVar16[uVar15] =
               GetBase64UrlChar::operator()(unsigned_char)::charTable
               [uVar11 >> ((byte)iVar12 & 0x1f) & 0x3f];
          iVar12 = iVar12 + -6;
          cVar4 = (char)iVar12;
          uVar9 = uVar9 + 1;
        } while (5 < uVar14);
        p = (void *)((long)p + 1);
        uVar6 = uVar14;
      } while (p < pbVar1);
    }
    if (uVar14 != 0) {
      pcVar16[uVar15 + 1] = puVar8[(uint)bVar2 << (-cVar4 & 0x1fU) & 0x3f];
      __s = pcVar16 + uVar15 + 2;
    }
  }
LAB_001432c7:
  if (__s < pcVar5) {
    memset(__s,0x3d,(long)pcVar5 - (long)__s);
    return length;
  }
  return length;
}

Assistant:

size_t
Base64Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 6;
	if (bitCount % 6)
		length++;

	if (!(flags & Base64EncodingFlag_NoPadding))
		length += 3 - ((length - 1) & 3);

	if (flags & Base64EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base64EncodingFlag_Multiline) {
		if (flags & Base64EncodingFlag_UrlChars)
			encodeImpl<GetBase64UrlChar, InsertNl>(dst, length, (uchar_t*)p, size);
		else
			encodeImpl<GetBase64Char, InsertNl>(dst, length, (uchar_t*)p, size);
	} else {
		if (flags & Base64EncodingFlag_UrlChars)
			encodeImpl<GetBase64UrlChar, InsertNoNl>(dst, length, (uchar_t*)p, size);
		else
			encodeImpl<GetBase64Char, InsertNoNl>(dst, length, (uchar_t*)p, size);
	}

	return length;
}